

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_help.c
# Opt level: O0

int cmd_help_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  undefined1 local_88 [8];
  option options [2];
  undefined1 local_40 [4];
  int local_3c;
  int opt_index;
  int opt;
  int argc;
  int rc;
  int *posc_local;
  char ***posv_local;
  char *cmdline_local;
  yl_opt *yo_local;
  
  opt = 0;
  opt_index = 0;
  _argc = posc;
  posc_local = (int *)posv;
  posv_local = (char ***)cmdline;
  cmdline_local = (char *)yo;
  memcpy(local_88,&PTR_anon_var_dwarf_a1_0011b970,0x40);
  opt = parse_cmdline((char *)posv_local,&opt_index,(char ***)(cmdline_local + 0xf8));
  yo_local._4_4_ = opt;
  if (opt == 0) {
    local_3c = getopt_long(opt_index,*(undefined8 *)(cmdline_local + 0xf8),commands[0].optstring,
                           local_88,local_40);
    if (local_3c == -1) {
      *(long *)posc_local = *(long *)(cmdline_local + 0xf8) + (long)_optind * 8;
      *_argc = opt_index - _optind;
      yo_local._4_4_ = opt;
    }
    else if (local_3c == 0x68) {
      cmd_help_help();
      yo_local._4_4_ = 1;
    }
    else {
      yl_log('\x01',"Unknown option.");
      yo_local._4_4_ = 1;
    }
  }
  return yo_local._4_4_;
}

Assistant:

int
cmd_help_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"help", no_argument, NULL, 'h'},
        {NULL, 0, NULL, 0}
    };

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_HELP].optstring, options, &opt_index)) != -1) {
        if (opt == 'h') {
            cmd_help_help();
            return 1;
        } else {
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return rc;
}